

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

void my_sighandler(int signum)

{
  AppCtx *pAVar1;
  char *fmt;
  int line;
  
  if (signum == 0xf) {
    fmt = "Received SIGTERM";
    line = 0x9a;
  }
  else {
    if (signum != 2) {
      return;
    }
    fmt = "Received SIGINT";
    line = 0x97;
  }
  log_log(0x40,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/tools/perfprof/main.c"
          ,line,fmt);
  pAVar1 = G_app_ctx_ptr;
  if ((signum == 0xf) || (signum == 2)) {
    G_app_ctx_ptr->should_terminate = true;
    (pAVar1->pool).aborted = true;
  }
  return;
}

Assistant:

static void my_sighandler(int signum) {
    switch (signum) {
    case SIGINT:
        log_warn("Received SIGINT");
        break;
    case SIGTERM:
        log_warn("Received SIGTERM");
        break;
    default:
        break;
    }
    if (signum == SIGTERM || signum == SIGINT) {
        G_app_ctx_ptr->should_terminate = true;
        G_app_ctx_ptr->pool.aborted = true;
    }
}